

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

void av1_tpl_rdmult_setup_sb(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE sb_size,int mi_row,int mi_col)

{
  byte bVar1;
  FRAME_TYPE frame_type;
  FRAME_UPDATE_TYPE FVar2;
  int iVar3;
  aom_bit_depth_t aVar4;
  int iVar5;
  AV1_PRIMARY *pAVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int is_stat_consumption_stage;
  int iVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int layer_depth;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  double dVar21;
  double local_70;
  double local_68;
  
  pAVar6 = cpi->ppi;
  bVar1 = cpi->gf_frame_index;
  iVar16 = (pAVar6->p_rc).gfu_boost;
  iVar10 = 0xf;
  if (iVar16 < 0x640) {
    iVar10 = iVar16 / 100;
  }
  iVar16 = (pAVar6->gf_group).layer_depth[bVar1];
  layer_depth = 6;
  if (iVar16 < 6) {
    layer_depth = iVar16;
  }
  if ((((bVar1 < 0x60) && ((pAVar6->tpl_data).tpl_frame[bVar1].is_valid != '\0')) &&
      (bVar1 = (pAVar6->gf_group).update_type[bVar1], bVar1 < 4)) &&
     ((bVar1 != 1 && ((cpi->oxcf).q_cfg.aq_mode == '\0')))) {
    frame_type = (cpi->common).current_frame.frame_type;
    uVar12 = (uint)(cpi->common).superres_scale_denominator;
    iVar14 = (int)(((cpi->common).superres_upscaled_width + 7 >> 2 & 0xfffffffeU) + 3) / 4;
    iVar15 = ((cpi->common).mi_params.mi_rows + 3) / 4;
    iVar16 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[sb_size]
              + 3 >> 2) + mi_row / 4;
    if (iVar15 < iVar16) {
      iVar16 = iVar15;
    }
    iVar7 = (int)(mi_col * uVar12 + 4) / 0x20;
    iVar15 = ((("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [sb_size] * uVar12 + 4 & 0xffff) >> 3) + 3 >> 2) + iVar7;
    if (iVar14 < iVar15) {
      iVar15 = iVar14;
    }
    lVar17 = (long)(mi_row / 4);
    lVar20 = lVar17 * iVar14;
    lVar19 = lVar20 * 8;
    lVar11 = (long)iVar14 * 8;
    local_68 = 0.0;
    local_70 = 0.0;
    for (lVar18 = lVar17; lVar13 = (long)iVar7, lVar18 < iVar16; lVar18 = lVar18 + 1) {
      for (; lVar13 < iVar15; lVar13 = lVar13 + 1) {
        dVar21 = log(*(double *)((long)cpi->tpl_rdmult_scaling_factors + lVar13 * 8 + lVar19));
        local_68 = local_68 + dVar21;
        local_70 = local_70 + 1.0;
      }
      lVar19 = lVar19 + lVar11;
    }
    iVar14 = (cpi->common).quant_params.y_dc_delta_q;
    iVar3 = (cpi->common).quant_params.base_qindex;
    aVar4 = ((cpi->common).seq_params)->bit_depth;
    FVar2 = (cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
    iVar5 = (cpi->oxcf).q_cfg.use_fixed_qp_offsets;
    iVar8 = ::is_stat_consumption_stage(cpi);
    iVar9 = av1_compute_rd_mult(iVar14 + iVar3,aVar4,FVar2,layer_depth,iVar10,frame_type,iVar5,iVar8
                                ,(cpi->oxcf).tune_cfg.tuning);
    iVar14 = x->rdmult_delta_qindex;
    iVar3 = (cpi->common).quant_params.base_qindex;
    iVar5 = (cpi->common).quant_params.y_dc_delta_q;
    aVar4 = ((cpi->common).seq_params)->bit_depth;
    FVar2 = (cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
    iVar8 = (cpi->oxcf).q_cfg.use_fixed_qp_offsets;
    is_stat_consumption_stage = ::is_stat_consumption_stage(cpi);
    iVar10 = av1_compute_rd_mult(iVar14 + iVar3 + iVar5,aVar4,FVar2,layer_depth,iVar10,frame_type,
                                 iVar8,is_stat_consumption_stage,(cpi->oxcf).tune_cfg.tuning);
    dVar21 = log((double)iVar10 / (double)iVar9);
    dVar21 = exp_bounded(dVar21 - local_68 / local_70);
    lVar20 = lVar20 * 8;
    for (; lVar19 = (long)iVar7, lVar17 < iVar16; lVar17 = lVar17 + 1) {
      for (; lVar19 < iVar15; lVar19 = lVar19 + 1) {
        *(double *)((long)cpi->ppi->tpl_sb_rdmult_scaling_factors + lVar19 * 8 + lVar20) =
             *(double *)((long)cpi->tpl_rdmult_scaling_factors + lVar19 * 8 + lVar20) * dVar21;
      }
      lVar20 = lVar20 + lVar11;
    }
  }
  return;
}

Assistant:

void av1_tpl_rdmult_setup_sb(AV1_COMP *cpi, MACROBLOCK *const x,
                             BLOCK_SIZE sb_size, int mi_row, int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int tpl_idx = cpi->gf_frame_index;

  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;

  if (tpl_idx >= MAX_TPL_FRAME_IDX) return;
  TplDepFrame *tpl_frame = &cpi->ppi->tpl_data.tpl_frame[tpl_idx];
  if (!tpl_frame->is_valid) return;
  if (!is_frame_tpl_eligible(gf_group, cpi->gf_frame_index)) return;
  if (cpi->oxcf.q_cfg.aq_mode != NO_AQ) return;

  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);
  const int sb_mi_width_sr = coded_to_superres_mi(
      mi_size_wide[sb_size], cm->superres_scale_denominator);

  const int bsize_base = BLOCK_16X16;
  const int num_mi_w = mi_size_wide[bsize_base];
  const int num_mi_h = mi_size_high[bsize_base];
  const int num_cols = (mi_cols_sr + num_mi_w - 1) / num_mi_w;
  const int num_rows = (cm->mi_params.mi_rows + num_mi_h - 1) / num_mi_h;
  const int num_bcols = (sb_mi_width_sr + num_mi_w - 1) / num_mi_w;
  const int num_brows = (mi_size_high[sb_size] + num_mi_h - 1) / num_mi_h;
  int row, col;

  double base_block_count = 0.0;
  double log_sum = 0.0;

  for (row = mi_row / num_mi_w;
       row < num_rows && row < mi_row / num_mi_w + num_brows; ++row) {
    for (col = mi_col_sr / num_mi_h;
         col < num_cols && col < mi_col_sr / num_mi_h + num_bcols; ++col) {
      const int index = row * num_cols + col;
      log_sum += log(cpi->tpl_rdmult_scaling_factors[index]);
      base_block_count += 1.0;
    }
  }

  const CommonQuantParams *quant_params = &cm->quant_params;

  const int orig_qindex_rdmult =
      quant_params->base_qindex + quant_params->y_dc_delta_q;
  const int orig_rdmult = av1_compute_rd_mult(
      orig_qindex_rdmult, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);

  const int new_qindex_rdmult = quant_params->base_qindex +
                                x->rdmult_delta_qindex +
                                quant_params->y_dc_delta_q;
  const int new_rdmult = av1_compute_rd_mult(
      new_qindex_rdmult, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);

  const double scaling_factor = (double)new_rdmult / (double)orig_rdmult;

  double scale_adj = log(scaling_factor) - log_sum / base_block_count;
  scale_adj = exp_bounded(scale_adj);

  for (row = mi_row / num_mi_w;
       row < num_rows && row < mi_row / num_mi_w + num_brows; ++row) {
    for (col = mi_col_sr / num_mi_h;
         col < num_cols && col < mi_col_sr / num_mi_h + num_bcols; ++col) {
      const int index = row * num_cols + col;
      cpi->ppi->tpl_sb_rdmult_scaling_factors[index] =
          scale_adj * cpi->tpl_rdmult_scaling_factors[index];
    }
  }
}